

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O3

double __thiscall ON_OutlineFigure::BoxArea(ON_OutlineFigure *this)

{
  bool bVar1;
  double dVar2;
  ON_BoundingBox bbox;
  ON_BoundingBox local_38;
  
  BoundingBox(&local_38,this);
  bVar1 = ON_BoundingBox::IsNotEmpty(&local_38);
  dVar2 = 0.0;
  if (bVar1) {
    if (0.0 <= local_38.m_max.y - local_38.m_min.y && 0.0 <= local_38.m_max.x - local_38.m_min.x) {
      dVar2 = (local_38.m_max.x - local_38.m_min.x) * (local_38.m_max.y - local_38.m_min.y);
    }
  }
  return dVar2;
}

Assistant:

double ON_OutlineFigure::BoxArea() const
{
  const ON_BoundingBox bbox = BoundingBox();
  double bbox_area = 0.0;
  if (bbox.IsNotEmpty())
  {
    const double dx = bbox.m_max.x - bbox.m_min.x;
    const double dy = bbox.m_max.y - bbox.m_min.y;
    bbox_area = (dx >= 0.0 && dy >= 0.0) ? (dx*dy) : 0.0;
  }
  else
  {
    bbox_area = 0.0;
  }
  return bbox_area;
}